

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quest.cpp
# Opt level: O0

bool __thiscall Quest_Context::TalkedNPC(Quest_Context *this,char vendor_id)

{
  bool bVar1;
  anon_class_1_1_d4ddee12 local_79;
  function<bool_(const_std::deque<util::variant,_std::allocator<util::variant>_>_&)> local_78;
  allocator local_41;
  string local_40;
  char local_19;
  Quest_Context *pQStack_18;
  char vendor_id_local;
  Quest_Context *this_local;
  
  local_19 = vendor_id;
  pQStack_18 = this;
  bVar1 = Quest::Disabled(this->quest);
  if (bVar1) {
    this_local._7_1_ = 0;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_40,"talkedtonpc",&local_41);
    local_79.vendor_id = local_19;
    std::function<bool(std::deque<util::variant,std::allocator<util::variant>>const&)>::
    function<Quest_Context::TalkedNPC(char)::__0,void>
              ((function<bool(std::deque<util::variant,std::allocator<util::variant>>const&)> *)
               &local_78,&local_79);
    this_local._7_1_ = EOPlus::Context::TriggerRule(&this->super_Context,&local_40,&local_78);
    std::function<bool_(const_std::deque<util::variant,_std::allocator<util::variant>_>_&)>::
    ~function(&local_78);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Quest_Context::TalkedNPC(char vendor_id)
{
	if (this->quest->Disabled())
		return false;

	return this->TriggerRule("talkedtonpc", [vendor_id](const std::deque<util::variant>& args) { return int(args[0]) == vendor_id; });
}